

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3ApiExit(sqlite3 *db,int rc)

{
  int rc_local;
  sqlite3 *db_local;
  
  if ((db->mallocFailed == '\0') && (rc != 0xc0a)) {
    db_local._4_4_ = rc & db->errMask;
  }
  else {
    db_local._4_4_ = apiOomError(db);
  }
  return db_local._4_4_;
}

Assistant:

SQLITE_PRIVATE int sqlite3ApiExit(sqlite3* db, int rc){
  /* If the db handle must hold the connection handle mutex here.
  ** Otherwise the read (and possible write) of db->mallocFailed 
  ** is unsafe, as is the call to sqlite3Error().
  */
  assert( db!=0 );
  assert( sqlite3_mutex_held(db->mutex) );
  if( db->mallocFailed || rc==SQLITE_IOERR_NOMEM ){
    return apiOomError(db);
  }
  return rc & db->errMask;
}